

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O2

void __thiscall CLI::OptionNotFound::~OptionNotFound(OptionNotFound *this)

{
  Error::~Error(&this->super_Error);
  operator_delete(this);
  return;
}

Assistant:

explicit OptionNotFound(std::string name) : OptionNotFound(name + " not found", ExitCodes::OptionNotFound) {}